

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O3

void __thiscall snmalloc::CombiningLockNode::wait<snmalloc::PALLinux>(CombiningLockNode *this)

{
  uint uVar1;
  void *__stat_loc;
  CombiningLockNode *this_00;
  bool bVar2;
  
  uVar1 = 0x65;
  do {
    if ((this->status)._M_i != WAITING) {
      return;
    }
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  LOCK();
  bVar2 = (this->status)._M_i == WAITING;
  if (bVar2) {
    (this->status)._M_i = SLEEPING;
  }
  UNLOCK();
  if (bVar2) {
    __stat_loc = (void *)0x3;
    this_00 = this;
    PALLinux::wait_on_address<snmalloc::CombiningLockNode::LockStatus>(&this->status,SLEEPING);
    if ((this->status)._M_i == SLEEPING) {
      wait<snmalloc::PALLinux>(this_00,__stat_loc);
    }
  }
  return;
}

Assistant:

void wait()
    {
      if constexpr (!use_wait_on_address<Pal>)
      {
        while (status.load(stl::memory_order_acquire) == LockStatus::WAITING)
          Aal::pause();
      }
      else
      {
        int remaining = 100;
        while (remaining > 0)
        {
          if (status.load(stl::memory_order_acquire) != LockStatus::WAITING)
            return;
          Aal::pause();
          remaining--;
        }
        LockStatus expected = LockStatus::WAITING;
        if (status.compare_exchange_strong(
              expected, LockStatus::SLEEPING, stl::memory_order_acq_rel))
        {
          Pal::wait_on_address(status, LockStatus::SLEEPING);
          if (status.load(stl::memory_order_acquire) == LockStatus::SLEEPING)
          {
            error("Corruption in core locking primitive. Aborting execution.");
          }
        }
      }
    }